

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O2

int __thiscall SID::output(SID *this,int bits)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = (1 << ((byte)bits & 0x1f)) >> 1;
  iVar1 = (this->extfilt).Vo / (int)(0xb340cU >> ((byte)bits & 0x1f));
  iVar2 = -iVar3;
  if (iVar1 != iVar2 && SBORROW4(iVar1,iVar2) == iVar1 + iVar3 < 0) {
    iVar2 = iVar1;
  }
  if (iVar3 <= iVar1) {
    iVar2 = iVar3 + -1;
  }
  return iVar2;
}

Assistant:

int SID::output(int bits)
{
  const int range = 1 << bits;
  const int half = range >> 1;
  int sample = extfilt.output()/((4095*255 >> 7)*3*15*2/range);
  if (sample >= half) {
    return half - 1;
  }
  if (sample < -half) {
    return -half;
  }
  return sample;
}